

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O1

void __thiscall Clone_componentWithImport_Test::TestBody(Clone_componentWithImport_Test *this)

{
  string *psVar1;
  ComponentPtr cClone;
  ComponentPtr c;
  ImportSourcePtr import;
  long *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  long local_58 [2];
  string *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined8 local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  libcellml::Component::create();
  libcellml::ImportSource::create();
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"some-other-model.xml","");
  libcellml::ImportSource::setUrl(local_38);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  psVar1 = local_48;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"unique","");
  libcellml::Entity::setId(psVar1);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  psVar1 = local_48;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"copy","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"imported_component_name","");
  libcellml::Component::setSourceComponent((shared_ptr *)local_48,(string *)&local_38);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  libcellml::Component::clone();
  local_28 = 0;
  p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  compareComponent((shared_ptr *)&local_48,(shared_ptr *)&local_68,(shared_ptr *)&local_28);
  if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  return;
}

Assistant:

TEST(Clone, componentWithImport)
{
    auto c = libcellml::Component::create();
    auto import = libcellml::ImportSource::create();
    import->setUrl("some-other-model.xml");

    c->setId("unique");
    c->setName("copy");
    c->setSourceComponent(import, "imported_component_name");

    auto cClone = c->clone();

    compareComponent(c, cClone);
}